

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_HPKE_Curve51_CP256_SHA512.c
# Opt level: O1

uint32_t Hacl_HPKE_Curve51_CP256_SHA512_sealBase
                   (uint8_t *skE,uint8_t *pkR,uint32_t infolen,uint8_t *info,uint32_t aadlen,
                   uint8_t *aad,uint32_t plainlen,uint8_t *plain,uint8_t *o_enc,uint8_t *o_ct)

{
  Hacl_Impl_HPKE_context_s o_ctx_00;
  uint32_t uVar1;
  uint32_t uVar2;
  uint8_t ctx_nonce [12];
  uint64_t ctx_seq;
  Hacl_Impl_HPKE_context_s o_ctx;
  uint8_t nonce [12];
  uint8_t ctx_key [32];
  uint8_t ctx_exporter [64];
  undefined8 local_c0;
  undefined4 local_b8;
  long local_b0;
  uint8_t *local_a8;
  undefined8 *puStack_a0;
  long *plStack_98;
  uint8_t *puStack_90;
  undefined8 local_88;
  byte local_80;
  byte bStack_7f;
  byte bStack_7e;
  byte bStack_7d;
  undefined1 local_78 [32];
  undefined1 local_58 [32];
  undefined1 local_38 [32];
  
  local_78 = ZEXT1632(ZEXT816(0) << 0x40);
  puStack_a0 = &local_c0;
  local_c0 = 0;
  local_b8 = 0;
  plStack_98 = &local_b0;
  local_b0 = 0;
  puStack_90 = local_58;
  local_58 = ZEXT1632(ZEXT816(0) << 0x40);
  o_ctx_00.ctx_nonce = (uint8_t *)puStack_a0;
  o_ctx_00.ctx_key = local_78;
  o_ctx_00.ctx_seq = (uint64_t *)plStack_98;
  o_ctx_00.ctx_exporter = puStack_90;
  local_a8 = local_78;
  local_38 = local_78;
  uVar1 = Hacl_HPKE_Curve51_CP256_SHA512_setupBaseS(o_enc,o_ctx_00,skE,pkR,infolen,info);
  uVar2 = 1;
  if (uVar1 == 0) {
    local_88 = CONCAT17((byte)((ulong)local_b0 >> 0x20) ^ local_c0._7_1_,
                        CONCAT16((byte)((ulong)local_b0 >> 0x28) ^ local_c0._6_1_,
                                 CONCAT15((byte)((ulong)local_b0 >> 0x30) ^ local_c0._5_1_,
                                          CONCAT14(local_c0._4_1_ ^ (byte)((ulong)local_b0 >> 0x38),
                                                   (int)local_c0))));
    _local_80 = CONCAT13((byte)local_b0 ^ local_b8._3_1_,
                         CONCAT12((byte)((ulong)local_b0 >> 8) ^ local_b8._2_1_,
                                  CONCAT11((byte)((ulong)local_b0 >> 0x10) ^ local_b8._1_1_,
                                           (byte)((ulong)local_b0 >> 0x18) ^ (byte)local_b8)));
    Hacl_AEAD_Chacha20Poly1305_Simd256_encrypt
              (o_ct,o_ct + plainlen,plain,plainlen,aad,aadlen,local_78,(uint8_t *)&local_88);
    if (local_b0 == -1) {
      uVar2 = 1;
    }
    else {
      uVar2 = 0;
    }
  }
  return uVar2;
}

Assistant:

uint32_t
Hacl_HPKE_Curve51_CP256_SHA512_sealBase(
  uint8_t *skE,
  uint8_t *pkR,
  uint32_t infolen,
  uint8_t *info,
  uint32_t aadlen,
  uint8_t *aad,
  uint32_t plainlen,
  uint8_t *plain,
  uint8_t *o_enc,
  uint8_t *o_ct
)
{
  uint8_t ctx_key[32U] = { 0U };
  uint8_t ctx_nonce[12U] = { 0U };
  uint64_t ctx_seq = 0ULL;
  uint8_t ctx_exporter[64U] = { 0U };
  Hacl_Impl_HPKE_context_s
  o_ctx =
    {
      .ctx_key = ctx_key,
      .ctx_nonce = ctx_nonce,
      .ctx_seq = &ctx_seq,
      .ctx_exporter = ctx_exporter
    };
  uint32_t
  res = Hacl_HPKE_Curve51_CP256_SHA512_setupBaseS(o_enc, o_ctx, skE, pkR, infolen, info);
  if (res == 0U)
  {
    uint8_t nonce[12U] = { 0U };
    uint64_t s = o_ctx.ctx_seq[0U];
    uint8_t enc[12U] = { 0U };
    store64_be(enc + 4U, s);
    KRML_MAYBE_FOR12(i,
      0U,
      12U,
      1U,
      uint8_t xi = enc[i];
      uint8_t yi = o_ctx.ctx_nonce[i];
      nonce[i] = (uint32_t)xi ^ (uint32_t)yi;);
    uint8_t *cipher = o_ct;
    uint8_t *tag = o_ct + plainlen;
    Hacl_AEAD_Chacha20Poly1305_Simd256_encrypt(cipher,
      tag,
      plain,
      plainlen,
      aad,
      aadlen,
      o_ctx.ctx_key,
      nonce);
    uint64_t s1 = o_ctx.ctx_seq[0U];
    uint32_t res1;
    if (s1 == 18446744073709551615ULL)
    {
      res1 = 1U;
    }
    else
    {
      uint64_t s_ = s1 + 1ULL;
      o_ctx.ctx_seq[0U] = s_;
      res1 = 0U;
    }
    uint32_t res10 = res1;
    return res10;
  }
  return 1U;
}